

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O1

double * u_mass_matrix(int n)

{
  double dVar1;
  double *t;
  double *w;
  double *b;
  double *a;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  uint n_00;
  
  n_00 = n + 1;
  uVar2 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar2 = (long)(int)n_00 * 8;
  }
  t = (double *)operator_new__(uVar2);
  w = (double *)operator_new__(uVar2);
  u_quadrature_rule(n_00,t,w);
  b = u_polynomial(n_00,n,t);
  a = (double *)operator_new__((ulong)(n_00 * n_00) << 3);
  if (-1 < n) {
    uVar2 = (ulong)n_00;
    uVar4 = 0;
    pdVar3 = b;
    pdVar5 = a;
    do {
      dVar1 = w[uVar4];
      uVar7 = 0;
      pdVar6 = pdVar3;
      do {
        pdVar5[uVar7] = *pdVar6 * dVar1;
        uVar7 = uVar7 + 1;
        pdVar6 = pdVar6 + uVar2;
      } while (uVar2 != uVar7);
      uVar4 = uVar4 + 1;
      pdVar5 = pdVar5 + uVar2;
      pdVar3 = pdVar3 + 1;
    } while (uVar4 != uVar2);
  }
  pdVar3 = r8mat_mm_new(n_00,n_00,n_00,a,b);
  if (b != (double *)0x0) {
    operator_delete__(b);
  }
  operator_delete__(a);
  operator_delete__(w);
  operator_delete__(t);
  return pdVar3;
}

Assistant:

double *u_mass_matrix ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    U_MASS_MATRIX computes the mass matrix for the Chebyshev U polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 July 2015
//
//  Author:
//
//    John Burkardt
//
{
  double *a;
  int i;
  int k;
  double *phi;
  double *phiw;
  double *w;
  double *x;

  x = new double[n+1];
  w = new double[n+1];

  u_quadrature_rule ( n + 1, x, w );

  phi = u_polynomial ( n + 1, n, x );

  phiw = new double[(n+1)*(n+1)];

  for ( k = 0; k <= n; k++ )
  {
    for ( i = 0; i <= n; i++ )
    {
      phiw[i+k*(n+1)] = w[k] * phi[k+i*(n+1)];
    }
  }

  a = r8mat_mm_new ( n + 1, n + 1, n + 1, phiw, phi );
//
//  Free memory.
//
  delete [] phi;
  delete [] phiw;
  delete [] w;
  delete [] x;

  return a;
}